

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O1

Impl * absl::time_internal::cctz::time_zone::Impl::UTCImpl(void)

{
  int iVar1;
  Impl *this;
  string local_38;
  
  if (UTCImpl()::utc_impl == '\0') {
    iVar1 = __cxa_guard_acquire(&UTCImpl()::utc_impl);
    if (iVar1 != 0) {
      this = (Impl *)operator_new(0x28);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"UTC","");
      Impl(this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      UTCImpl::utc_impl = this;
      __cxa_guard_release(&UTCImpl()::utc_impl);
    }
  }
  return UTCImpl::utc_impl;
}

Assistant:

const time_zone::Impl* time_zone::Impl::UTCImpl() {
  static const Impl* utc_impl = new Impl("UTC");  // never fails
  return utc_impl;
}